

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::NewSequentialFile
          (InMemoryEnv *this,string *fname,SequentialFile **result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__mutex;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
  *this_00;
  FileState *this_01;
  int iVar1;
  iterator iVar2;
  undefined8 *puVar3;
  mapped_type *ppFVar4;
  undefined8 uVar5;
  undefined8 *in_RCX;
  long in_FS_OFFSET;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = &fname->field_2;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
               *)((long)&fname[1].field_2 + 8);
    iVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
            ::find(this_00,(key_type *)result);
    if (iVar2._M_node == (_Base_ptr)(fname + 2)) {
      *in_RCX = 0;
      local_48.data_ = (char *)*result;
      local_48.size_ = (size_t)result[1];
      local_58.data_ = "File not found";
      local_58.size_ = 0xe;
      Status::Status((Status *)this,kIOError,&local_48,&local_58);
    }
    else {
      puVar3 = (undefined8 *)operator_new(0x18);
      ppFVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_leveldb::(anonymous_namespace)::FileState_*>_>_>
                ::operator[](this_00,(key_type *)result);
      this_01 = *ppFVar4;
      *puVar3 = &PTR__SequentialFileImpl_00b3f0e0;
      puVar3[1] = this_01;
      puVar3[2] = 0;
      FileState::Ref(this_01);
      *in_RCX = puVar3;
      (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (Status)(char *)this;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar5 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      _Unwind_Resume(uVar5);
    }
  }
  __stack_chk_fail();
}

Assistant:

Status NewSequentialFile(const std::string& fname,
                           SequentialFile** result) override {
    MutexLock lock(&mutex_);
    if (file_map_.find(fname) == file_map_.end()) {
      *result = nullptr;
      return Status::IOError(fname, "File not found");
    }

    *result = new SequentialFileImpl(file_map_[fname]);
    return Status::OK();
  }